

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PostfixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  UnaryExpression *expr;
  Expression *pEVar1;
  PostfixUnaryExpressionSyntax *this;
  bool bVar2;
  ExpressionSyntax *syntax_00;
  Expression *pEVar3;
  ConstantValue **ppCVar4;
  SourceLocation location;
  Diagnostic *diag_00;
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool local_121;
  Diagnostic *diag;
  bitmask<slang::ast::ASTFlags> local_88;
  bitmask<slang::ast::ASTFlags> local_80;
  bitmask<slang::ast::ASTFlags> local_78;
  bitmask<slang::ast::AssignFlags> local_6c;
  SourceLocation local_68;
  SourceRange local_60;
  UnaryOperator local_4c;
  UnaryExpression *local_48;
  Expression *result;
  Type *type;
  Expression *local_30;
  Expression *operand;
  ASTContext *context_local;
  PostfixUnaryExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  operand = (Expression *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (PostfixUnaryExpressionSyntax *)compilation;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->operand);
  pEVar3 = operand;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&type,LValue);
  local_30 = Expression::create(compilation,syntax_00,(ASTContext *)pEVar3,
                                (bitmask<slang::ast::ASTFlags>)type,(Type *)0x0);
  result = (Expression *)not_null::operator_cast_to_Type_((not_null *)&local_30->type);
  this = syntax_local;
  local_4c = Expression::getUnaryOperator(context_local->lookupIndex);
  pEVar1 = local_30;
  pEVar3 = result;
  local_60 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_48 = BumpAllocator::
             emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                       ((BumpAllocator *)this,&local_4c,(Type *)pEVar3,pEVar1,&local_60);
  bVar2 = Expression::bad(local_30);
  pEVar1 = operand;
  pEVar3 = local_30;
  if (bVar2) {
LAB_006854f7:
    pEVar3 = Expression::badExpr((Compilation *)syntax_local,&local_48->super_Expression);
    return pEVar3;
  }
  local_68 = parsing::Token::location((Token *)&context_local[1].flags);
  memset(&local_6c,0,4);
  bitmask<slang::ast::AssignFlags>::bitmask(&local_6c);
  bVar2 = Expression::requireLValue
                    (pEVar3,(ASTContext *)pEVar1,local_68,local_6c,(Expression *)0x0,
                     (EvalContext *)0x0);
  if (!bVar2) goto LAB_006854f7;
  ppCVar4 = &operand->constant;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_78,NonProcedural);
  bVar2 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)ppCVar4,&local_78);
  if (bVar2) {
    ppCVar4 = &operand->constant;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_80,AssignmentAllowed);
    bVar2 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)ppCVar4,&local_80);
    local_121 = true;
    if (!bVar2) goto LAB_006855b1;
  }
  ppCVar4 = &operand->constant;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_88,AssignmentDisallowed);
  local_121 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)ppCVar4,&local_88)
  ;
LAB_006855b1:
  pEVar3 = operand;
  if (local_121 != false) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    ASTContext::addDiag((ASTContext *)pEVar3,(DiagCode)0x500007,sourceRange);
    pEVar3 = Expression::badExpr((Compilation *)syntax_local,&local_48->super_Expression);
    return pEVar3;
  }
  bVar2 = Type::isNumeric((Type *)result);
  pEVar3 = operand;
  expr = local_48;
  if (!bVar2) {
    location = parsing::Token::location((Token *)&context_local[1].flags);
    diag_00 = ASTContext::addDiag((ASTContext *)pEVar3,(DiagCode)0x310007,location);
    ast::operator<<(diag_00,(Type *)result);
    Diagnostic::operator<<(diag_00,local_30->sourceRange);
    pEVar3 = Expression::badExpr((Compilation *)syntax_local,&local_48->super_Expression);
    return pEVar3;
  }
  syntax_01 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&context_local->instanceOrProc);
  ASTContext::setAttributes((ASTContext *)pEVar3,&expr->super_Expression,syntax_01);
  return &local_48->super_Expression;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PostfixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    // This method is only ever called for postincrement and postdecrement operators, so
    // the operand must be an lvalue.
    Expression& operand = create(compilation, *syntax.operand, context, ASTFlags::LValue);
    const Type* type = operand.type;

    Expression* result = compilation.emplace<UnaryExpression>(getUnaryOperator(syntax.kind), *type,
                                                              operand, syntax.sourceRange());
    if (operand.bad() || !operand.requireLValue(context, syntax.operatorToken.location()))
        return badExpr(compilation, result);

    if ((context.flags.has(ASTFlags::NonProcedural) &&
         !context.flags.has(ASTFlags::AssignmentAllowed)) ||
        context.flags.has(ASTFlags::AssignmentDisallowed)) {
        context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
        return badExpr(compilation, result);
    }

    if (!type->isNumeric()) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}